

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * aobjnam(obj *otmp,char *verb)

{
  char *s;
  size_t sVar1;
  char *__src;
  char prefix [80];
  char acStack_78 [88];
  
  s = cxname(otmp);
  if (otmp->quan != 1) {
    sprintf(acStack_78,"%d ");
    s = strprepend(s,acStack_78);
  }
  if (verb != (char *)0x0) {
    sVar1 = strlen(s);
    (s + sVar1)[0] = ' ';
    (s + sVar1)[1] = '\0';
    __src = otense(otmp,verb);
    strcat(s,__src);
  }
  return s;
}

Assistant:

char *aobjnam(const struct obj *otmp, const char *verb)
{
	char *bp = cxname(otmp);
	char prefix[PREFIX];

	if (otmp->quan != 1L) {
		sprintf(prefix, "%d ", otmp->quan);
		bp = strprepend(bp, prefix);
	}

	if (verb) {
	    strcat(bp, " ");
	    strcat(bp, otense(otmp, verb));
	}
	return bp;
}